

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.cpp
# Opt level: O1

void __thiscall duckdb::Linenoise::EditMoveWordRight(Linenoise *this)

{
  size_t sVar1;
  
  if (this->pos == this->len) {
    return;
  }
  do {
    sVar1 = Utf8Proc::NextGraphemeCluster(this->buf,this->len,this->pos);
    this->pos = sVar1;
    if (sVar1 == this->len) break;
  } while ((0xf5 < (byte)(this->buf[sVar1] - 0x3aU)) ||
          (0xe5 < (byte)((this->buf[sVar1] & 0xdfU) + 0xa5)));
  RefreshLine(this);
  return;
}

Assistant:

void Linenoise::EditMoveWordRight() {
	if (pos == len) {
		return;
	}
	do {
		pos = NextChar();
	} while (pos != len && !IsWordBoundary(buf[pos]));
	RefreshLine();
}